

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O1

Spectrum * __thiscall
phyr::SamplerIntegrator::specularReflect
          (Spectrum *__return_storage_ptr__,SamplerIntegrator *this,Ray *ray,
          SurfaceInteraction *isect,Scene *scene,Sampler *sampler,MemoryPool *pool,int depth)

{
  BSDF *this_00;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector3f wi;
  double pdf;
  Point3f op;
  Vector3f wo;
  CoefficientSpectrum<60> cs_2;
  Spectrum f;
  CoefficientSpectrum<60> cs;
  CoefficientSpectrum<60> cs_1;
  double local_210 [60];
  
  wo.z = (isect->super_Interaction).wo.z;
  wo.x = (isect->super_Interaction).wo.x;
  wo.y = (isect->super_Interaction).wo.y;
  wi.z = 0.0;
  wi.x = 0.0;
  wi.y = 0.0;
  this_00 = isect->bsdf;
  (*sampler->_vptr_Sampler[5])(sampler);
  BSDF::sample_f(&f,this_00,&wo,&wi,(Point2f *)&cs_2,&pdf,BSDF_SPECULAR|BSDF_REFLECTION,
                 (BxDFType *)0x0);
  if (0.0 < pdf) {
    if ((f.super_CoefficientSpectrum<60>.samples[0] == 0.0) &&
       (!NAN(f.super_CoefficientSpectrum<60>.samples[0]))) {
      uVar1 = 0;
      while (uVar3 = uVar1, uVar3 != 0x3b) {
        dVar8 = f.super_CoefficientSpectrum<60>.samples[uVar3 + 1];
        if ((dVar8 != 0.0) || (uVar1 = uVar3 + 1, NAN(dVar8))) break;
      }
      if (0x3a < uVar3) goto LAB_00141276;
    }
    dVar8 = (isect->shadingGeom).n.z * wi.z +
            (isect->shadingGeom).n.x * wi.x + (isect->shadingGeom).n.y * wi.y;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = (isect->super_Interaction).n.z;
      dVar6 = (isect->super_Interaction).n.x;
      dVar7 = (isect->super_Interaction).n.y;
      dVar9 = (ABS(dVar6) * (isect->super_Interaction).pfError.x +
               ABS(dVar7) * (isect->super_Interaction).pfError.y +
              ABS(dVar8) * (isect->super_Interaction).pfError.z) * 1024.0;
      cs_2.samples[0] = dVar9 * dVar6;
      cs_2.samples[1] = dVar9 * dVar7;
      cs_2.samples[2] = dVar9 * dVar8;
      if (wi.z * dVar8 + wi.x * dVar6 + wi.y * dVar7 < 0.0) {
        cs_2.samples[0] = -(dVar9 * dVar6);
        cs_2.samples[1] = -(dVar9 * dVar7);
        cs_2.samples[2] = -(dVar9 * dVar8);
      }
      op.x = (isect->super_Interaction).p.x + cs_2.samples[0];
      op.y = (isect->super_Interaction).p.y + cs_2.samples[1];
      op.z = (isect->super_Interaction).p.z + cs_2.samples[2];
      iVar2 = 0;
      do {
        lVar4 = 0;
        if (iVar2 != 0) {
          lVar4 = (ulong)(iVar2 != 1) * 8 + 8;
        }
        dVar8 = *(double *)((long)cs_2.samples + lVar4);
        if (dVar8 <= 0.0) {
          if (dVar8 < 0.0) {
            dVar8 = *(double *)((long)&op.x + lVar4);
            if (-INFINITY < dVar8) {
              dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8 |
                              -(ulong)(dVar8 == 0.0) & 0x8000000000000000);
              dVar8 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
            }
            goto LAB_001410e7;
          }
        }
        else {
          dVar8 = *(double *)((long)&op.x + lVar4);
          if (dVar8 < INFINITY) {
            dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
            dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
          }
LAB_001410e7:
          *(double *)((long)&op.x + lVar4) = dVar8;
        }
        iVar2 = iVar2 + 1;
        if (iVar2 == 3) {
          (*(this->super_Integrator)._vptr_Integrator[4])
                    (local_210,this,&op,scene,sampler,pool,(ulong)(depth + 1));
          lVar4 = 0;
          memset(&cs,0,0x1e0);
          do {
            dVar8 = f.super_CoefficientSpectrum<60>.samples[lVar4 + 1];
            dVar6 = local_210[lVar4 + 1];
            cs.samples[lVar4] = local_210[lVar4] * f.super_CoefficientSpectrum<60>.samples[lVar4];
            cs.samples[lVar4 + 1] = dVar6 * dVar8;
            lVar4 = lVar4 + 2;
          } while (lVar4 != 0x3c);
          dVar8 = wi.y * (isect->shadingGeom).n.y;
          dVar6 = wi.x * (isect->shadingGeom).n.x;
          dVar7 = wi.z * (isect->shadingGeom).n.z;
          lVar4 = 0;
          memset(&cs_1,0,0x1e0);
          dVar7 = dVar7 + dVar6 + dVar8;
          do {
            dVar8 = cs.samples[lVar4 + 1];
            cs_1.samples[lVar4] = cs.samples[lVar4] * ABS(dVar7);
            cs_1.samples[lVar4 + 1] = dVar8 * ABS(dVar7);
            lVar4 = lVar4 + 2;
          } while (lVar4 != 0x3c);
          lVar4 = 0;
          memset(&cs_2,0,0x1e0);
          do {
            auVar5._8_8_ = pdf;
            auVar5._0_8_ = pdf;
            auVar5 = divpd(*(undefined1 (*) [16])(cs_1.samples + lVar4),auVar5);
            *(undefined1 (*) [16])(cs_2.samples + lVar4) = auVar5;
            lVar4 = lVar4 + 2;
          } while (lVar4 != 0x3c);
          memcpy(__return_storage_ptr__,&cs_2,0x1e0);
          return __return_storage_ptr__;
        }
      } while( true );
    }
  }
LAB_00141276:
  memset(__return_storage_ptr__,0,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum SamplerIntegrator::specularReflect(const Ray& ray,
                                            const SurfaceInteraction& isect,
                                            const Scene& scene, Sampler& sampler,
                                            MemoryPool& pool, int depth) const {
    // Compute specular reflection direction _wi_ and BSDF value
    Vector3f wo = isect.wo, wi;
    Real pdf;
    BxDFType type = BxDFType(BSDF_REFLECTION | BSDF_SPECULAR);
    Spectrum f = isect.bsdf->sample_f(wo, &wi, sampler.getNextSample2D(), &pdf, type);

    // Return contribution of specular reflection
    const Normal3f &ns = isect.shadingGeom.n;
    if (pdf > 0.f && !f.isBlack() && absDot(wi, ns) != 0.f) {
        // Compute ray differential _rd_ for specular reflection
        Ray rd = isect.emitRay(wi);

// @todo: Uncomment once RayDifferentials are implemented
#if 0
        if (ray.hasDifferentials) {
            rd.hasDifferentials = true;
            rd.rxOrigin = isect.p + isect.dpdx;
            rd.ryOrigin = isect.p + isect.dpdy;
            // Compute differential reflected directions
            Normal3f dndx = isect.shading.dndu * isect.dudx +
                            isect.shading.dndv * isect.dvdx;
            Normal3f dndy = isect.shading.dndu * isect.dudy +
                            isect.shading.dndv * isect.dvdy;
            Vector3f dwodx = -ray.rxDirection - wo,
                     dwody = -ray.ryDirection - wo;
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection =
                wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);
        }
#endif
        return f * li(rd, scene, sampler, pool, depth + 1) * absDot(wi, ns) / pdf;
    } else { return Spectrum(0.f); }
}